

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O2

void __thiscall
slang::syntax::StandardCaseItemSyntax::setChild
          (StandardCaseItemSyntax *this,size_t index,TokenOrSyntax child)

{
  undefined4 uVar1;
  SyntaxNode *pSVar2;
  SyntaxNode *pSVar3;
  Token TVar4;
  
  if (index == 2) {
    pSVar2 = TokenOrSyntax::node(&child);
    if (pSVar2 == (SyntaxNode *)0x0) {
      pSVar2 = (SyntaxNode *)0x0;
    }
    else {
      pSVar2 = TokenOrSyntax::node(&child);
    }
    (this->clause).ptr = pSVar2;
  }
  else if (index == 1) {
    TVar4 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    (this->colon).kind = TVar4.kind;
    (this->colon).field_0x2 = TVar4._2_1_;
    (this->colon).numFlags = (NumericTokenFlags)TVar4.numFlags.raw;
    (this->colon).rawLen = TVar4.rawLen;
    (this->colon).info = TVar4.info;
  }
  else {
    pSVar3 = TokenOrSyntax::node(&child);
    uVar1 = *(undefined4 *)&pSVar3->field_0x4;
    pSVar2 = pSVar3->parent;
    (this->expressions).super_SyntaxListBase.super_SyntaxNode.kind = pSVar3->kind;
    *(undefined4 *)&(this->expressions).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar1;
    (this->expressions).super_SyntaxListBase.super_SyntaxNode.parent = pSVar2;
    (this->expressions).super_SyntaxListBase.super_SyntaxNode.previewNode = pSVar3->previewNode;
    (this->expressions).super_SyntaxListBase.childCount = *(size_t *)(pSVar3 + 1);
    pSVar2 = pSVar3[1].previewNode;
    (this->expressions).elements._M_ptr = (pointer)pSVar3[1].parent;
    (this->expressions).elements._M_extent._M_extent_value = (size_t)pSVar2;
  }
  return;
}

Assistant:

void StandardCaseItemSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: expressions = child.node()->as<SeparatedSyntaxList<ExpressionSyntax>>(); return;
        case 1: colon = child.token(); return;
        case 2: clause = child.node() ? &child.node()->as<SyntaxNode>() : nullptr; return;
        default: SLANG_UNREACHABLE;
    }
}